

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O1

uint32_t * unpack30_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint uVar1;
  
  *out = (*in & 0x3fffffff) + base;
  uVar1 = *in;
  out[1] = uVar1 >> 0x1e;
  out[1] = (uVar1 >> 0x1e) + base + (in[1] & 0xfffffff) * 4;
  uVar1 = in[1];
  out[2] = uVar1 >> 0x1c;
  out[2] = (uVar1 >> 0x1c) + base + (in[2] & 0x3ffffff) * 0x10;
  uVar1 = in[2];
  out[3] = uVar1 >> 0x1a;
  out[3] = (uVar1 >> 0x1a) + base + (in[3] & 0xffffff) * 0x40;
  uVar1 = in[3];
  out[4] = uVar1 >> 0x18;
  out[4] = (uVar1 >> 0x18) + base + (in[4] & 0x3fffff) * 0x100;
  uVar1 = in[4];
  out[5] = uVar1 >> 0x16;
  out[5] = (uVar1 >> 0x16) + base + (in[5] & 0xfffff) * 0x400;
  uVar1 = in[5];
  out[6] = uVar1 >> 0x14;
  out[6] = (uVar1 >> 0x14) + base + (in[6] & 0x3ffff) * 0x1000;
  uVar1 = in[6];
  out[7] = uVar1 >> 0x12;
  out[7] = (uVar1 >> 0x12) + base + (in[7] & 0xffff) * 0x4000;
  return in + 8;
}

Assistant:

uint32_t * unpack30_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out = ( (*in) >>  0  )   % (1U << 30 )  ;
    *out += base;
    out++;
    *out = ( (*in) >>  30  ) ;
    ++in;
    *out |= ((*in) % (1U<< 28 ))<<( 30 - 28 );
    *out += base;
    out++;
    *out = ( (*in) >>  28  ) ;
    ++in;
    *out |= ((*in) % (1U<< 26 ))<<( 30 - 26 );
    *out += base;
    out++;
    *out = ( (*in) >>  26  ) ;
    ++in;
    *out |= ((*in) % (1U<< 24 ))<<( 30 - 24 );
    *out += base;
    out++;
    *out = ( (*in) >>  24  ) ;
    ++in;
    *out |= ((*in) % (1U<< 22 ))<<( 30 - 22 );
    *out += base;
    out++;
    *out = ( (*in) >>  22  ) ;
    ++in;
    *out |= ((*in) % (1U<< 20 ))<<( 30 - 20 );
    *out += base;
    out++;
    *out = ( (*in) >>  20  ) ;
    ++in;
    *out |= ((*in) % (1U<< 18 ))<<( 30 - 18 );
    *out += base;
    out++;
    *out = ( (*in) >>  18  ) ;
    ++in;
    *out |= ((*in) % (1U<< 16 ))<<( 30 - 16 );
    *out += base;
    out++;

    return in + 1;
}